

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.h
# Opt level: O0

MultiJittered * __thiscall pm::World::createSampler<pm::MultiJittered,int>(World *this,int *args)

{
  reference this_00;
  pointer pSVar1;
  unique_ptr<pm::MultiJittered,_std::default_delete<pm::MultiJittered>_> local_28;
  unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_> local_20;
  int *local_18;
  int *args_local;
  World *this_local;
  
  local_18 = args;
  args_local = (int *)this;
  std::make_unique<pm::MultiJittered,int>((int *)&local_28);
  std::unique_ptr<pm::Sampler,std::default_delete<pm::Sampler>>::
  unique_ptr<pm::MultiJittered,std::default_delete<pm::MultiJittered>,void>
            ((unique_ptr<pm::Sampler,std::default_delete<pm::Sampler>> *)&local_20,&local_28);
  std::
  vector<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
  ::push_back(&this->samplers_,(value_type *)&local_20);
  std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>::~unique_ptr(&local_20);
  std::unique_ptr<pm::MultiJittered,_std::default_delete<pm::MultiJittered>_>::~unique_ptr
            (&local_28);
  this_00 = std::
            vector<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
            ::back(&this->samplers_);
  pSVar1 = std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>::get(this_00);
  return (MultiJittered *)pSVar1;
}

Assistant:

T *World::createSampler(Args &&... args)
{
	samplers_.push_back(std::make_unique<T>(std::forward<Args>(args)...));
	return static_cast<T *>(samplers_.back().get());
}